

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  String local_60;
  String local_50;
  TimeInMillis local_40;
  string local_38;
  
  bVar1 = UnitTest::Passed(unit_test);
  local_40 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>((internal *)&local_50,&local_40);
  String::Format((char *)&local_60,"event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                 (ulong)bVar1,local_50.c_str_);
  String::operator_cast_to_string(&local_38,&local_60);
  Send(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  String::~String(&local_60);
  String::~String(&local_50);
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    Send(String::Format("event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                        unit_test.Passed(),
                        StreamableToString(unit_test.elapsed_time()).c_str()));
  }